

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::EndPhase(Func *this,Phase tag,bool dump)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode executionMode;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  undefined4 *puVar8;
  undefined7 in_register_00000011;
  DbCheckPostLower local_40;
  DbCheckPostLower dbCheck;
  
  EndProfiler(this,tag);
  if ((int)CONCAT71(in_register_00000011,dump) != 0) {
    uVar4 = GetSourceContextId(this);
    uVar5 = GetLocalFunctionId(this);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,tag,uVar4,uVar5);
    if (!bVar3) {
      uVar4 = GetSourceContextId(this);
      uVar5 = GetLocalFunctionId(this);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01433318,BackEndPhase,uVar4,uVar5);
      if (!bVar3) goto LAB_0040a918;
    }
    Output::Print(L"-----------------------------------------------------------------------------\n"
                 );
    bVar3 = IsLoopBody(this);
    dbCheck.func = (Func *)(&Js::PhaseNames)[tag];
    executionMode = JITTimeWorkItem::GetJitMode(this->m_workItem);
    pcVar7 = ExecutionModeName(executionMode);
    if (bVar3) {
      uVar4 = JITTimeWorkItem::GetLoopNumber(this->m_workItem);
      Output::Print(L"************   IR after %s (%S) Loop %d ************\n",dbCheck.func,pcVar7,
                    (ulong)uVar4);
    }
    else {
      Output::Print(L"************   IR after %s (%S)  ************\n",dbCheck.func,pcVar7);
    }
    Dump(this,(uint)DAT_014302ef);
  }
LAB_0040a918:
  if (tag == FinalLowerPhase) {
    uVar6 = *(uint *)&this->field_0x240;
    if ((uVar6 & 0x3000000) != 0x1000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x54c,"(this->isPostLayout && !this->isPostFinalLower)",
                         "this->isPostLayout && !this->isPostFinalLower");
      if (!bVar3) {
LAB_0040abe1:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      uVar6 = *(uint *)&this->field_0x240;
    }
    uVar6 = uVar6 | 0x2000000;
  }
  else if (tag == RegAllocPhase) {
    uVar1 = *(uint *)&this->field_0x240;
    uVar6 = uVar1 | 0x80000;
    *(uint *)&this->field_0x240 = uVar6;
    if ((uVar1 >> 0x16 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x53d,"(!this->isPostRegAlloc)","!this->isPostRegAlloc");
      if (!bVar3) goto LAB_0040abe1;
      *puVar8 = 0;
      uVar6 = *(uint *)&this->field_0x240;
    }
    uVar6 = uVar6 | 0x400000;
  }
  else if (tag == PeepsPhase) {
    uVar6 = *(uint *)&this->field_0x240;
    if ((uVar6 & 0x1200000) != 0x200000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x542,"(this->isPostLower && !this->isPostLayout)",
                         "this->isPostLower && !this->isPostLayout");
      if (!bVar3) goto LAB_0040abe1;
      *puVar8 = 0;
      uVar6 = *(uint *)&this->field_0x240;
    }
    uVar6 = uVar6 | 0x800000;
  }
  else {
    if (tag != LayoutPhase) {
      if (tag == LowererPhase) {
        uVar6 = *(uint *)&this->field_0x240;
        if ((uVar6 >> 0x15 & 1) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                             ,0x534,"(!this->isPostLower)","!this->isPostLower");
          if (!bVar3) goto LAB_0040abe1;
          *puVar8 = 0;
          uVar6 = *(uint *)&this->field_0x240;
        }
        *(uint *)&this->field_0x240 = uVar6 | 0x200000;
        local_40.func = this;
        DbCheckPostLower::CheckNestedHelperCalls(&local_40);
      }
      goto LAB_0040abb5;
    }
    uVar6 = *(uint *)&this->field_0x240;
    if ((uVar6 & 0x1800000) != 0x800000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x547,"(this->isPostPeeps && !this->isPostLayout)",
                         "this->isPostPeeps && !this->isPostLayout");
      if (!bVar3) goto LAB_0040abe1;
      *puVar8 = 0;
      uVar6 = *(uint *)&this->field_0x240;
    }
    uVar6 = uVar6 | 0x1000000;
  }
  *(uint *)&this->field_0x240 = uVar6;
LAB_0040abb5:
  if ((this->field_0x242 & 0x20) != 0) {
    local_40.func = this;
    DbCheckPostLower::Check(&local_40);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::MergeDelayFreeList
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this->m_alloc);
  return;
}

Assistant:

void
Func::EndPhase(Js::Phase tag, bool dump)
{
    this->EndProfiler(tag);
#if DBG_DUMP
    if(dump && (PHASE_DUMP(tag, this)
        || PHASE_DUMP(Js::BackEndPhase, this)))
    {
        Output::Print(_u("-----------------------------------------------------------------------------\n"));

        if (IsLoopBody())
        {
            Output::Print(_u("************   IR after %s (%S) Loop %d ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()),
                m_workItem->GetLoopNumber());
        }
        else
        {
            Output::Print(_u("************   IR after %s (%S)  ************\n"),
                Js::PhaseNames[tag],
                ExecutionModeName(m_workItem->GetJitMode()));
        }
        this->Dump(Js::Configuration::Global.flags.AsmDiff? IRDumpFlags_AsmDumpMode : IRDumpFlags_None);
    }
#endif

    if (tag == Js::RegAllocPhase)
    {
        this->legalizePostRegAlloc = true;
    }

#if DBG
    if (tag == Js::LowererPhase)
    {
        Assert(!this->isPostLower);
        this->isPostLower = true;
#if !defined(_M_ARM) && !defined(_M_ARM64) // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);
        dbCheck.CheckNestedHelperCalls();
#endif
    }
    else if (tag == Js::RegAllocPhase)
    {
        Assert(!this->isPostRegAlloc);
        this->isPostRegAlloc = true;
    }
    else if (tag == Js::PeepsPhase)
    {
        Assert(this->isPostLower && !this->isPostLayout);
        this->isPostPeeps = true;
    }
    else if (tag == Js::LayoutPhase)
    {
        Assert(this->isPostPeeps && !this->isPostLayout);
        this->isPostLayout = true;
    }
    else if (tag == Js::FinalLowerPhase)
    {
        Assert(this->isPostLayout && !this->isPostFinalLower);
        this->isPostFinalLower = true;
    }
    if (this->isPostLower)
    {
#ifndef _M_ARM    // Need to verify ARM is clean.
        DbCheckPostLower dbCheck(this);

        dbCheck.Check();
#endif
    }
    this->m_alloc->MergeDelayFreeList();
#endif
}